

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

char * ImParseFormatFindEnd(char *fmt)

{
  uint uVar1;
  char *pcVar2;
  char cVar3;
  
  if (*fmt == '%') {
    cVar3 = '%';
    pcVar2 = fmt + 1;
    while (cVar3 != '\0') {
      if ((byte)(cVar3 + 0xbfU) < 0x1a) {
        uVar1 = 0x900 >> ((byte)(cVar3 - 1) & 0x1f);
joined_r0x0016c254:
        if ((uVar1 & 1) == 0) {
          return pcVar2;
        }
      }
      else if ((byte)(cVar3 + 0x9fU) < 0x1a) {
        uVar1 = 0x2480a80 >> ((byte)(cVar3 - 1) & 0x1f);
        goto joined_r0x0016c254;
      }
      cVar3 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    }
    fmt = pcVar2 + -1;
  }
  return fmt;
}

Assistant:

const char* ImParseFormatFindEnd(const char* fmt)
{
    // Printf/scanf types modifiers: I/L/h/j/l/t/w/z. Other uppercase letters qualify as types aka end of the format.
    if (fmt[0] != '%')
        return fmt;
    const unsigned int ignored_uppercase_mask = (1 << ('I'-'A')) | (1 << ('L'-'A'));
    const unsigned int ignored_lowercase_mask = (1 << ('h'-'a')) | (1 << ('j'-'a')) | (1 << ('l'-'a')) | (1 << ('t'-'a')) | (1 << ('w'-'a')) | (1 << ('z'-'a'));
    for (char c; (c = *fmt) != 0; fmt++)
    {
        if (c >= 'A' && c <= 'Z' && ((1 << (c - 'A')) & ignored_uppercase_mask) == 0)
            return fmt + 1;
        if (c >= 'a' && c <= 'z' && ((1 << (c - 'a')) & ignored_lowercase_mask) == 0)
            return fmt + 1;
    }
    return fmt;
}